

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O1

_Bool Check_Char(FIELDTYPE *typ,int ch,TypeArgument *argp)

{
  _Bool _Var1;
  ushort **ppuVar2;
  
  do {
    if (typ == (FIELDTYPE *)0x0) {
LAB_003ec0eb:
      ppuVar2 = __ctype_b_loc();
      return (_Bool)((*(byte *)((long)*ppuVar2 + ((ulong)(uint)ch & 0xff) * 2 + 1) & 0x40) >> 6);
    }
    if ((typ->status & 1) == 0) {
      if (typ->ccheck != (_func__Bool_int_void_ptr *)0x0) {
        _Var1 = (*typ->ccheck)(ch,argp);
        return _Var1;
      }
      goto LAB_003ec0eb;
    }
    if (argp == (TypeArgument *)0x0) {
      __assert_fail("argp != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CursesDialog/form/frm_driver.c"
                    ,0x335,"_Bool Check_Char(FIELDTYPE *, int, TypeArgument *)");
    }
    _Var1 = Check_Char(typ->left,ch,argp->left);
    if (_Var1) {
      return true;
    }
    typ = typ->right;
    argp = argp->right;
  } while( true );
}

Assistant:

static bool Check_Char(FIELDTYPE * typ, int ch, TypeArgument *argp)
{
  if (typ) 
    {
      if (typ->status & _LINKED_TYPE)
        {
          assert(argp != 0);
          return(
            Check_Char(typ->left ,ch,argp->left ) ||
            Check_Char(typ->right,ch,argp->right) );
        } 
      else 
        {
          if (typ->ccheck)
            return typ->ccheck(ch,(void *)argp);
        }
    }
  return (isprint((unsigned char)ch) ? TRUE : FALSE);
}